

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O2

void sect_PopSection(void)

{
  SectionStackEntry *__ptr;
  char *fmt;
  
  __ptr = sectionStack;
  if (sectionStack == (SectionStackEntry *)0x0) {
    fmt = "No entries in the section stack\n";
  }
  else {
    if (currentLoadSection == (Section *)0x0) {
      changeSection();
      currentSection = __ptr->section;
      currentLoadSection = __ptr->loadSection;
      sym_SetCurrentSymbolScope(__ptr->scope);
      curOffset = __ptr->offset;
      loadOffset = __ptr->loadOffset;
      unionStack = __ptr->unionStack;
      sectionStack = __ptr->next;
      free(__ptr);
      return;
    }
    fmt = "Cannot change the section within a `LOAD` block\n";
  }
  fatalerror(fmt);
}

Assistant:

void sect_PopSection(void)
{
	if (!sectionStack)
		fatalerror("No entries in the section stack\n");

	if (currentLoadSection)
		fatalerror("Cannot change the section within a `LOAD` block\n");

	struct SectionStackEntry *entry = sectionStack;

	changeSection();
	currentSection = entry->section;
	currentLoadSection = entry->loadSection;
	sym_SetCurrentSymbolScope(entry->scope);
	curOffset = entry->offset;
	loadOffset = entry->loadOffset;
	unionStack = entry->unionStack;

	sectionStack = entry->next;
	free(entry);
}